

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.cc
# Opt level: O2

int anon_unknown.dwarf_6c60c::connect(int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  runtime_error *prVar5;
  undefined4 in_register_0000003c;
  string *psVar6;
  string asStack_1c8 [32];
  stringstream ss;
  ostream local_198 [376];
  
  psVar6 = (string *)CONCAT44(in_register_0000003c,__fd);
  iVar1 = nn_socket(1,0x21);
  if (iVar1 < 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar3 = std::operator<<(local_198,"nn_socket: ");
    iVar1 = nn_errno();
    pcVar4 = nn_strerror(iVar1);
    std::operator<<(poVar3,pcVar4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,asStack_1c8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = nn_connect(iVar1,*(char **)psVar6);
  if (-1 < iVar2) {
    iVar2 = nn_setsockopt(iVar1,0x21,1,"",0);
    if (-1 < iVar2) {
      return iVar1;
    }
    nn_close(iVar1);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar3 = std::operator<<(local_198,"nn_setsockopt: ");
    iVar1 = nn_errno();
    pcVar4 = nn_strerror(iVar1);
    std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(local_198," (");
    poVar3 = std::operator<<(poVar3,psVar6);
    std::operator<<(poVar3,")");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,asStack_1c8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  nn_close(iVar1);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = std::operator<<(local_198,"nn_connect: ");
  iVar1 = nn_errno();
  pcVar4 = nn_strerror(iVar1);
  std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(local_198," (");
  poVar3 = std::operator<<(poVar3,psVar6);
  std::operator<<(poVar3,")");
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar5,asStack_1c8);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int connect(const std::string& endpoint) {
  auto fd = nn_socket(AF_SP, NN_SUB);
  if (fd < 0) {
    std::stringstream ss;
    ss << "nn_socket: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }

  auto rv = nn_connect(fd, endpoint.c_str());
  if (rv < 0) {
    nn_close(fd);
    std::stringstream ss;
    ss << "nn_connect: " << nn_strerror(nn_errno());
    ss << " (" << endpoint << ")";
    throw std::runtime_error(ss.str());
  }

  rv = nn_setsockopt(fd, NN_SUB, NN_SUB_SUBSCRIBE, "", 0);
  if (rv < 0) {
    nn_close(fd);
    std::stringstream ss;
    ss << "nn_setsockopt: " << nn_strerror(nn_errno());
    ss << " (" << endpoint << ")";
    throw std::runtime_error(ss.str());
  }

  return fd;
}